

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

bool __thiscall QGenericItemModel::clearItemData(QGenericItemModel *this,QModelIndex *index)

{
  bool bVar1;
  QModelIndex *in_RDI;
  Op unaff_retaddr;
  
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84faa0);
  bVar1 = QGenericItemModelImplBase::call<bool,QModelIndex>
                    ((QGenericItemModelImplBase *)index,unaff_retaddr,in_RDI);
  return bVar1;
}

Assistant:

bool QGenericItemModel::clearItemData(const QModelIndex &index)
{
    return impl->call<bool>(QGenericItemModelImplBase::ClearItemData, index);
}